

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O3

void Prs_ManWriteVerilogSignal(FILE *pFile,Prs_Ntk_t *p,int Sig)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  char *pcVar5;
  Vec_Str_t *p_00;
  char *pcVar6;
  uint uVar7;
  
  if (Sig < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x11a,"int Abc_Lit2Var2(int)");
  }
  uVar7 = (uint)Sig >> 2;
  switch(Sig & 3) {
  case 0:
    pcVar5 = Prs_ObjGetName(p,uVar7);
    break;
  case 1:
    if ((p->vSlices).nSize <= (int)uVar7) goto LAB_0034d56a;
    pcVar5 = Prs_ObjGetName(p,(p->vSlices).pArray[uVar7]);
    if ((p->vSlices).nSize <= (int)(uVar7 + 1)) goto LAB_0034d56a;
    iVar1 = (p->vSlices).pArray[uVar7 + 1];
    if (iVar1 == 0) {
      p_00 = Abc_NamBuffer(p->pStrs);
      uVar7 = 0;
    }
    else {
      if (iVar1 < 0) {
LAB_0034d589:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      pVVar3 = p->vHash->vObjs;
      uVar4 = iVar1 * 4;
      if (pVVar3->nSize <= (int)uVar4) goto LAB_0034d589;
      piVar2 = pVVar3->pArray;
      uVar7 = piVar2[uVar4];
      uVar4 = piVar2[(ulong)uVar4 + 1];
      p_00 = Abc_NamBuffer(p->pStrs);
      if (uVar7 != uVar4) {
        pcVar6 = Vec_StrPrintF(p_00,"[%d:%d]",(ulong)uVar7,(ulong)uVar4);
        goto LAB_0034d52c;
      }
    }
    pcVar6 = Vec_StrPrintF(p_00,"[%d]",(ulong)uVar7);
LAB_0034d52c:
    fprintf((FILE *)pFile,"%s%s",pcVar5,pcVar6);
    return;
  case 2:
    pcVar5 = Abc_NamStr(p->pFuns,uVar7);
    break;
  case 3:
    uVar4 = (p->vConcats).nSize;
    if ((int)uVar7 < (int)uVar4) {
      piVar2 = (p->vConcats).pArray;
      Prs_CatSignals_V._0_4_ = piVar2[uVar7];
      Prs_CatSignals_V._4_4_ = Prs_CatSignals_V._0_4_;
      if (uVar7 + 1 < uVar4) {
        Prs_CatSignals_V._8_8_ = piVar2 + (uVar7 + 1);
        fputc(0x7b,(FILE *)pFile);
        Prs_ManWriteVerilogArray(pFile,p,(Vec_Int_t *)Prs_CatSignals_V,0);
        fputc(0x7d,(FILE *)pFile);
        return;
      }
      goto LAB_0034d589;
    }
LAB_0034d56a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  fputs(pcVar5,(FILE *)pFile);
  return;
}

Assistant:

static void Prs_ManWriteVerilogSignal( FILE * pFile, Prs_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME )
        fprintf( pFile, "%s", Prs_ObjGetName(p, Value) );
    else if ( Type == CBA_PRS_CONST )
        fprintf( pFile, "%s", Prs_NtkConst(p, Value) );
    else if ( Type == CBA_PRS_SLICE )
        fprintf( pFile, "%s%s", Prs_ObjGetName(p, Prs_SliceName(p, Value)), Prs_ManWriteRange(p, Prs_SliceRange(p, Value), 1) );
    else if ( Type == CBA_PRS_CONCAT )
        Prs_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}